

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

QcListEntry * qc_list_enumentry(QcList *list)

{
  QcListEntry *cur;
  QcList *list_local;
  
  list_local = (QcList *)list->cur;
  if (list_local == (QcList *)0x0) {
    list_local = (QcList *)0x0;
  }
  else {
    list->cur = list_local->head;
  }
  return (QcListEntry *)list_local;
}

Assistant:

QcListEntry* qc_list_enumentry(QcList *list)
{
    QcListEntry *cur;
    
    cur = list->cur;
    if(cur)
    {
        list->cur = cur->next;
        return cur;
    }

    return NULL;
}